

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab.c
# Opt level: O0

void test_read_format_cab(void)

{
  uchar *in_RCX;
  size_t in_RDX;
  size_t siglen;
  size_t siglen_00;
  size_t in_R8;
  
  verify((EVP_PKEY_CTX *)"test_read_format_cab_1.cab",(uchar *)0x0,in_RDX,in_RCX,in_R8);
  verify2("test_read_format_cab_1.cab",STORE);
  verify3("test_read_format_cab_1.cab",STORE);
  verify((EVP_PKEY_CTX *)"test_read_format_cab_2.cab",(uchar *)0x1,siglen,in_RCX,in_R8);
  verify2("test_read_format_cab_2.cab",MSZIP);
  verify3("test_read_format_cab_2.cab",MSZIP);
  verify((EVP_PKEY_CTX *)"test_read_format_cab_3.cab",(uchar *)0x2,siglen_00,in_RCX,in_R8);
  verify2("test_read_format_cab_3.cab",LZX);
  verify3("test_read_format_cab_3.cab",LZX);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cab)
{
	/* Verify Cabinet file in no compression. */
	verify("test_read_format_cab_1.cab", STORE);
	verify2("test_read_format_cab_1.cab", STORE);
	verify3("test_read_format_cab_1.cab", STORE);
	/* Verify Cabinet file in MSZIP. */
	verify("test_read_format_cab_2.cab", MSZIP);
	verify2("test_read_format_cab_2.cab", MSZIP);
	verify3("test_read_format_cab_2.cab", MSZIP);
	/* Verify Cabinet file in LZX. */
	verify("test_read_format_cab_3.cab", LZX);
	verify2("test_read_format_cab_3.cab", LZX);
	verify3("test_read_format_cab_3.cab", LZX);
}